

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgenfil.cpp
# Opt level: O0

void CTcIdFixup::load_object_file
               (CVmFile *fp,void *xlat,ulong xlat_cnt,tcgen_xlat_type xlat_type,
               size_t stream_element_size,textchar_t *fname,CTcIdFixup **fixup_list_head)

{
  unsigned_long uVar1;
  ulong uVar2;
  CTcDataStream *ds;
  ulong uVar3;
  CTcIdFixup **list_head;
  uint in_ECX;
  CTcDataStream *in_RDX;
  long in_RSI;
  long in_R8;
  undefined8 in_R9;
  long in_stack_00000008;
  CTcDataStream *stream;
  ulong new_id;
  ulong old_id;
  ulong ofs;
  char buf [9];
  ulong cnt;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  CTcDataStream *in_stack_ffffffffffffff98;
  CTcDataStream *in_stack_ffffffffffffffa0;
  CTcDataStream *ofs_00;
  undefined1 auStack_40 [4];
  undefined1 auStack_3c [4];
  ulong local_38;
  undefined8 local_30;
  long local_28;
  uint local_1c;
  CTcDataStream *local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = CVmFile::read_uint4((CVmFile *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  do {
    if (local_38 == 0) {
      return;
    }
    CVmFile::read_bytes((CVmFile *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    in_stack_ffffffffffffff98 =
         CTcDataStream::get_stream_from_id
                   ((char)((ulong)in_stack_ffffffffffffff98 >> 0x38),
                    (textchar_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    uVar1 = ::osrp4(auStack_40);
    uVar2 = uVar1 & 0xffffffff;
    uVar1 = ::osrp4(auStack_3c);
    ds = (CTcDataStream *)(uVar1 & 0xffffffff);
    if (in_stack_ffffffffffffff98 != (CTcDataStream *)0x0) {
      uVar3 = CTcDataStream::get_object_file_start_ofs(in_stack_ffffffffffffff98);
      list_head = (CTcIdFixup **)(uVar3 + uVar2);
      ofs_00 = ds;
      if (local_10 != 0) {
        if (local_18 <= ds) {
          CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e22,local_30);
          goto LAB_002026cd;
        }
        if (local_1c == 0) {
          in_stack_ffffffffffffffa0 = (CTcDataStream *)(ulong)*(uint *)(local_10 + (long)ds * 4);
        }
        else if (local_1c == 1) {
          in_stack_ffffffffffffffa0 = (CTcDataStream *)(ulong)*(ushort *)(local_10 + (long)ds * 2);
        }
        else if (local_1c == 2) {
          in_stack_ffffffffffffffa0 = *(CTcDataStream **)(local_10 + (long)ds * 8);
        }
        in_stack_ffffffffffffff94 = local_1c;
        if (local_28 == 2) {
          CTcDataStream::write2_at
                    (in_stack_ffffffffffffffa0,(ulong)in_stack_ffffffffffffff98,local_1c);
          ofs_00 = in_stack_ffffffffffffffa0;
        }
        else {
          CTcDataStream::write4_at
                    (in_stack_ffffffffffffffa0,(ulong)in_stack_ffffffffffffff98,
                     CONCAT44(local_1c,in_stack_ffffffffffffff90));
          ofs_00 = in_stack_ffffffffffffffa0;
        }
      }
      in_stack_ffffffffffffffa0 = ofs_00;
      if (in_stack_00000008 != 0) {
        add_fixup(list_head,ds,(ulong)ofs_00,(ulong)in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa0 = ofs_00;
      }
    }
LAB_002026cd:
    local_38 = local_38 - 1;
  } while( true );
}

Assistant:

void CTcIdFixup::load_object_file(CVmFile *fp,
                                  const void *xlat,
                                  ulong xlat_cnt,
                                  tcgen_xlat_type xlat_type,
                                  size_t stream_element_size,
                                  const textchar_t *fname,
                                  CTcIdFixup **fixup_list_head)
{
    ulong cnt;

    /* read the count, then read the fixups */
    for (cnt = fp->read_uint4() ; cnt != 0 ; --cnt)
    {
        char buf[9];
        ulong ofs;
        ulong old_id;
        ulong new_id;
        CTcDataStream *stream;

        /* read the next fixup */
        fp->read_bytes(buf, 9);
        stream = CTcDataStream::get_stream_from_id(buf[0], fname);
        ofs = t3rp4u(buf+1);
        old_id = t3rp4u(buf+5);

        /* if the stream was invalid, ignore this record */
        if (stream == 0)
            continue;

        /* adjust the offset for the stream's start in this object file */
        ofs += stream->get_object_file_start_ofs();

        /* apply the fixup if a translation table was provided */
        if (xlat != 0)
        {
            /* make sure the count is in range - if it's not, ignore it */
            if (old_id >= xlat_cnt)
            {
                /* note the problem */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_OBJFILE_INVAL_OBJ_ID, fname);

                /* ignore the record */
                continue;
            }

            /* look up the new ID */
            switch(xlat_type)
            {
            case TCGEN_XLAT_OBJ:
                new_id = ((const tctarg_obj_id_t *)xlat)[old_id];
                break;

            case TCGEN_XLAT_PROP:
                new_id = ((const tctarg_prop_id_t *)xlat)[old_id];
                break;

            case TCGEN_XLAT_ENUM:
                new_id = ((const ulong *)xlat)[old_id];
                break;
            }

            /* apply the fixup */
            if (stream_element_size == 2)
                stream->write2_at(ofs, (uint)new_id);
            else
                stream->write4_at(ofs, new_id);
        }
        else
        {
            /* use the original ID for now */
            new_id = old_id;
        }

        /* 
         *   If we're keeping object fixups in the new file, create a fixup
         *   for the reference.  Note that the fixup is for the new ID, not
         *   the old ID, because we've already translated the value in the
         *   stream to the new ID.  
         */
        if (fixup_list_head != 0)
            CTcIdFixup::add_fixup(fixup_list_head, stream, ofs, new_id);
    }
}